

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditable.h
# Opt level: O2

TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> __thiscall
rtosc::MidiMapperStorage::
TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_>::insert
          (TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> *this,
          function<void_(short,_std::function<void_(const_char_*)>)> *t_)

{
  int i;
  long lVar1;
  long lVar2;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> TVar3;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> next;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> local_30;
  
  TinyVector(&local_30,this->n + 1);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < this->n; lVar1 = lVar1 + 1) {
    std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=
              ((function<void_(short,_std::function<void_(const_char_*)>)> *)
               ((long)&((local_30.t)->super__Function_base)._M_functor + lVar2),
               (function<void_(short,_std::function<void_(const_char_*)>)> *)
               ((long)&(this->t->super__Function_base)._M_functor + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=
            (local_30.t + this->n,t_);
  TVar3._4_4_ = 0;
  TVar3.n = local_30.n;
  TVar3.t = local_30.t;
  return TVar3;
}

Assistant:

TinyVector insert(const T &t_)
            {TinyVector next(n+1); for(int i=0;i<n; ++i) next.t[i]=t[i]; next.t[n] = t_;return next;}